

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_estimateCDictSize(size_t dictSize,int compressionLevel)

{
  ulong uVar1;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters local_2c;
  
  ZSTD_getCParams_internal
            (&local_2c,compressionLevel,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
  uVar1 = (1L << ((byte)local_2c.hashLog & 0x3f)) + 0x3fU & 0xffffffffffffffc0;
  if (local_2c.windowLog < 0xf) {
    uVar1 = 0;
  }
  if (local_2c.strategy - ZSTD_btlazy2 < 0xfffffffd) {
    uVar1 = 0;
  }
  return uVar1 + (dictSize + 7 & 0xfffffffffffffff8) + (4L << ((byte)local_2c.chainLog & 0x3f)) +
                 (4L << ((byte)local_2c.hashLog & 0x3f)) + 0x3a40;
}

Assistant:

size_t ZSTD_estimateCDictSize(size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters const cParams = ZSTD_getCParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    return ZSTD_estimateCDictSize_advanced(dictSize, cParams, ZSTD_dlm_byCopy);
}